

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4161a3::Node::dump(Node *this)

{
  char *pcVar1;
  undefined1 local_38 [8];
  OutputStream S;
  char *Buffer;
  Node *this_local;
  
  S._24_8_ = malloc(0x400);
  OutputStream::OutputStream((OutputStream *)local_38,(char *)S._24_8_,0x400);
  print(this,(OutputStream *)local_38);
  OutputStream::operator+=((OutputStream *)local_38,'\0');
  pcVar1 = OutputStream::getBuffer((OutputStream *)local_38);
  printf("Symbol dump for %p: %s\n",this,pcVar1);
  pcVar1 = OutputStream::getBuffer((OutputStream *)local_38);
  free(pcVar1);
  return;
}

Assistant:

LLVM_DUMP_METHOD void dump() const {
    char *Buffer = static_cast<char*>(std::malloc(1024));
    OutputStream S(Buffer, 1024);
    print(S);
    S += '\0';
    printf("Symbol dump for %p: %s\n", (const void*)this, S.getBuffer());
    std::free(S.getBuffer());
  }